

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t validation_layer::zeInit(ze_init_flags_t flags)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  ze_result_t result;
  ze_result_t zVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar5 = context;
  lVar9 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"zeInit(flags)","");
  if (*(char *)(lVar9 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar9 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar5 + 0x90);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar9 = *(long *)(lVar5 + 0xd30);
    lVar2 = *(long *)(lVar5 + 0xd38);
    lVar8 = lVar2 - lVar9;
    if (lVar8 == 0) {
      result = (*pcVar1)(flags);
    }
    else {
      lVar8 = lVar8 >> 3;
      lVar7 = 0;
      do {
        puVar3 = (undefined8 *)**(undefined8 **)(*(long *)(lVar5 + 0xd30) + lVar7 * 8);
        result = (**(code **)*puVar3)(puVar3,flags);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014993e;
        lVar7 = lVar7 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
      zVar6 = (*pcVar1)(flags);
      result = zVar6;
      if (lVar2 != lVar9) {
        lVar9 = 0;
        do {
          plVar4 = (long *)**(undefined8 **)(*(long *)(lVar5 + 0xd30) + lVar9 * 8);
          result = (**(code **)(*plVar4 + 8))(plVar4,flags,zVar6);
          if (result != ZE_RESULT_SUCCESS) break;
          lVar9 = lVar9 + 1;
          result = zVar6;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
      }
    }
  }
LAB_0014993e:
  logAndPropagateResult("zeInit",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInit(
        ze_init_flags_t flags                           ///< [in] initialization flags.
                                                        ///< must be 0 (default) or a combination of ::ze_init_flag_t.
        )
    {
        context.logger->log_trace("zeInit(flags)");

        auto pfnInit = context.zeDdiTable.Global.pfnInit;

        if( nullptr == pfnInit )
            return logAndPropagateResult("zeInit", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        auto driver_result = pfnInit( flags );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitEpilogue( flags ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        return logAndPropagateResult("zeInit", driver_result);
    }